

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_listener.hpp
# Opt level: O3

TestEventListener * __thiscall
iutest::TestEventListeners::Release(TestEventListeners *this,TestEventListener *listener)

{
  TestEventListener **__src;
  __normal_iterator<iutest::TestEventListener_**,_std::vector<iutest::TestEventListener_*,_std::allocator<iutest::TestEventListener_*>_>_>
  __dest;
  TestEventListener **ppTVar1;
  
  if (this->m_default_result_printer == listener) {
    this->m_default_result_printer = (TestEventListener *)0x0;
  }
  if (this->m_default_xml_generator == listener) {
    this->m_default_xml_generator = (TestEventListener *)0x0;
  }
  __dest = std::
           __find_if<__gnu_cxx::__normal_iterator<iutest::TestEventListener**,std::vector<iutest::TestEventListener*,std::allocator<iutest::TestEventListener*>>>,__gnu_cxx::__ops::_Iter_equals_val<iutest::TestEventListener*const>>
                     ((this->m_repeater).m_listeners.
                      super__Vector_base<iutest::TestEventListener_*,_std::allocator<iutest::TestEventListener_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (this->m_repeater).m_listeners.
                      super__Vector_base<iutest::TestEventListener_*,_std::allocator<iutest::TestEventListener_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  ppTVar1 = (this->m_repeater).m_listeners.
            super__Vector_base<iutest::TestEventListener_*,_std::allocator<iutest::TestEventListener_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (__dest._M_current == ppTVar1) {
    listener = (TestEventListener *)0x0;
  }
  else {
    __src = __dest._M_current + 1;
    if (__src != ppTVar1) {
      memmove(__dest._M_current,__src,(long)ppTVar1 - (long)__src);
      ppTVar1 = (this->m_repeater).m_listeners.
                super__Vector_base<iutest::TestEventListener_*,_std::allocator<iutest::TestEventListener_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    (this->m_repeater).m_listeners.
    super__Vector_base<iutest::TestEventListener_*,_std::allocator<iutest::TestEventListener_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppTVar1 + -1;
  }
  return listener;
}

Assistant:

TestEventListener* Release(TestEventListener* listener)
    {
        if( listener == m_default_result_printer )
        {
            m_default_result_printer = NULL;
        }
        if( listener == m_default_xml_generator )
        {
            m_default_xml_generator = NULL;
        }
        return m_repeater.Release(listener);
    }